

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtCompoundCompoundCollisionAlgorithm::cbtCompoundCompoundCollisionAlgorithm
          (cbtCompoundCompoundCollisionAlgorithm *this,cbtCollisionAlgorithmConstructionInfo *ci,
          cbtCollisionObjectWrapper *body0Wrap,cbtCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  cbtHashedSimplePairCache *this_00;
  
  cbtCompoundCollisionAlgorithm::cbtCompoundCollisionAlgorithm
            (&this->super_cbtCompoundCollisionAlgorithm,ci,body0Wrap,body1Wrap,isSwapped);
  (this->super_cbtCompoundCollisionAlgorithm).super_cbtActivatingCollisionAlgorithm.
  super_cbtCollisionAlgorithm._vptr_cbtCollisionAlgorithm =
       (_func_int **)&PTR__cbtCompoundCompoundCollisionAlgorithm_01194420;
  (this->m_removePairs).m_ownsMemory = true;
  (this->m_removePairs).m_data = (cbtSimplePair *)0x0;
  (this->m_removePairs).m_size = 0;
  (this->m_removePairs).m_capacity = 0;
  this_00 = (cbtHashedSimplePairCache *)cbtAlignedAllocInternal(0x68,0x10);
  cbtHashedSimplePairCache::cbtHashedSimplePairCache(this_00);
  this->m_childCollisionAlgorithmCache = this_00;
  this->m_compoundShapeRevision0 = body0Wrap->m_shape[3].m_shapeType;
  this->m_compoundShapeRevision1 = body1Wrap->m_shape[3].m_shapeType;
  return;
}

Assistant:

cbtCompoundCompoundCollisionAlgorithm::cbtCompoundCompoundCollisionAlgorithm(const cbtCollisionAlgorithmConstructionInfo& ci, const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, bool isSwapped)
	: cbtCompoundCollisionAlgorithm(ci, body0Wrap, body1Wrap, isSwapped)
{
	void* ptr = cbtAlignedAlloc(sizeof(cbtHashedSimplePairCache), 16);
	m_childCollisionAlgorithmCache = new (ptr) cbtHashedSimplePairCache();

	const cbtCollisionObjectWrapper* col0ObjWrap = body0Wrap;
	cbtAssert(col0ObjWrap->getCollisionShape()->isCompound());

	const cbtCollisionObjectWrapper* col1ObjWrap = body1Wrap;
	cbtAssert(col1ObjWrap->getCollisionShape()->isCompound());

	const cbtCompoundShape* compoundShape0 = static_cast<const cbtCompoundShape*>(col0ObjWrap->getCollisionShape());
	m_compoundShapeRevision0 = compoundShape0->getUpdateRevision();

	const cbtCompoundShape* compoundShape1 = static_cast<const cbtCompoundShape*>(col1ObjWrap->getCollisionShape());
	m_compoundShapeRevision1 = compoundShape1->getUpdateRevision();
}